

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

TokenPattern * __thiscall
TokenPattern::doCat(TokenPattern *__return_storage_ptr__,TokenPattern *this,TokenPattern *tokpat)

{
  bool bVar1;
  int4 iVar2;
  int iVar3;
  SleighError *pSVar4;
  reference ppTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_d1;
  string local_d0 [32];
  __normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_> local_b0;
  Token **local_a8;
  __normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_> local_a0;
  Token **local_98;
  __normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_> local_90;
  const_iterator iter;
  string local_80 [38];
  undefined1 local_5a;
  allocator local_59;
  string local_58 [48];
  uint local_28;
  undefined1 local_21;
  int4 sa;
  TokenPattern *tokpat_local;
  TokenPattern *this_local;
  TokenPattern *res;
  
  local_21 = 0;
  _sa = tokpat;
  tokpat_local = this;
  this_local = __return_storage_ptr__;
  TokenPattern(__return_storage_ptr__,(Pattern *)0x0);
  __return_storage_ptr__->leftellipsis = (bool)(this->leftellipsis & 1);
  __return_storage_ptr__->rightellipsis = (bool)(this->rightellipsis & 1);
  std::vector<Token_*,_std::allocator<Token_*>_>::operator=
            (&__return_storage_ptr__->toklist,&this->toklist);
  if (((this->rightellipsis & 1U) == 0) && ((_sa->leftellipsis & 1U) == 0)) {
    local_28 = 0;
    __gnu_cxx::__normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_>::
    __normal_iterator(&local_90);
    local_98 = (Token **)std::vector<Token_*,_std::allocator<Token_*>_>::begin(&this->toklist);
    local_90._M_current = local_98;
    while( true ) {
      local_a0._M_current =
           (Token **)std::vector<Token_*,_std::allocator<Token_*>_>::end(&this->toklist);
      bVar1 = __gnu_cxx::operator!=(&local_90,&local_a0);
      if (!bVar1) break;
      ppTVar5 = __gnu_cxx::
                __normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_>::
                operator*(&local_90);
      iVar2 = Token::getSize(*ppTVar5);
      local_28 = iVar2 + local_28;
      __gnu_cxx::__normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_>
      ::operator++(&local_90);
    }
    local_a8 = (Token **)std::vector<Token_*,_std::allocator<Token_*>_>::begin(&_sa->toklist);
    local_90._M_current = local_a8;
    while( true ) {
      local_b0._M_current =
           (Token **)std::vector<Token_*,_std::allocator<Token_*>_>::end(&_sa->toklist);
      bVar1 = __gnu_cxx::operator!=(&local_90,&local_b0);
      if (!bVar1) break;
      ppTVar5 = __gnu_cxx::
                __normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_>::
                operator*(&local_90);
      std::vector<Token_*,_std::allocator<Token_*>_>::push_back
                (&__return_storage_ptr__->toklist,ppTVar5);
      __gnu_cxx::__normal_iterator<Token_*const_*,_std::vector<Token_*,_std::allocator<Token_*>_>_>
      ::operator++(&local_90);
    }
    __return_storage_ptr__->rightellipsis = (bool)(_sa->rightellipsis & 1);
  }
  else {
    if (((this->rightellipsis & 1U) != 0) && (bVar1 = alwaysInstructionTrue(_sa), !bVar1)) {
      local_5a = 1;
      pSVar4 = (SleighError *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Interior ellipsis in pattern",&local_59);
      SleighError::SleighError(pSVar4,(string *)local_58);
      local_5a = 0;
      __cxa_throw(pSVar4,&SleighError::typeinfo,SleighError::~SleighError);
    }
    if ((_sa->leftellipsis & 1U) != 0) {
      bVar1 = alwaysInstructionTrue(this);
      if (!bVar1) {
        iter._M_current._6_1_ = 1;
        pSVar4 = (SleighError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_80,"Interior ellipsis in pattern",(allocator *)((long)&iter._M_current + 7)
                  );
        SleighError::SleighError(pSVar4,(string *)local_80);
        iter._M_current._6_1_ = 0;
        __cxa_throw(pSVar4,&SleighError::typeinfo,SleighError::~SleighError);
      }
      __return_storage_ptr__->leftellipsis = true;
    }
    local_28 = 0xffffffff;
  }
  if (((__return_storage_ptr__->rightellipsis & 1U) != 0) &&
     ((__return_storage_ptr__->leftellipsis & 1U) != 0)) {
    pSVar4 = (SleighError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Double ellipsis in pattern",&local_d1);
    SleighError::SleighError(pSVar4,(string *)local_d0);
    __cxa_throw(pSVar4,&SleighError::typeinfo,SleighError::~SleighError);
  }
  if ((int)local_28 < 0) {
    iVar3 = (*this->pattern->_vptr_Pattern[5])(this->pattern,_sa->pattern,0);
    __return_storage_ptr__->pattern = (Pattern *)CONCAT44(extraout_var,iVar3);
  }
  else {
    iVar3 = (*this->pattern->_vptr_Pattern[5])(this->pattern,_sa->pattern,(ulong)local_28);
    __return_storage_ptr__->pattern = (Pattern *)CONCAT44(extraout_var_00,iVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenPattern TokenPattern::doCat(const TokenPattern &tokpat) const

{				// Return Concatenation of -this- and -tokpat-
  TokenPattern res((Pattern *)0);
  int4 sa;

  res.leftellipsis = leftellipsis;
  res.rightellipsis = rightellipsis;
  res.toklist = toklist;
  if (rightellipsis||tokpat.leftellipsis) { // Check for interior ellipsis
    if (rightellipsis) {
      if (!tokpat.alwaysInstructionTrue())
	throw SleighError("Interior ellipsis in pattern");
    }
    if (tokpat.leftellipsis) {
      if (!alwaysInstructionTrue())
	throw SleighError("Interior ellipsis in pattern");
      res.leftellipsis = true;
    }
    sa = -1;
  }
  else {
    sa = 0;
    vector<Token *>::const_iterator iter;

    for(iter=toklist.begin();iter!=toklist.end();++iter)
      sa += (*iter)->getSize();
    for(iter=tokpat.toklist.begin();iter!=tokpat.toklist.end();++iter)
      res.toklist.push_back(*iter);
    res.rightellipsis = tokpat.rightellipsis;
  }
  if (res.rightellipsis && res.leftellipsis)
    throw SleighError("Double ellipsis in pattern");
  if (sa < 0)
    res.pattern = pattern->doAnd(tokpat.pattern,0);
  else
    res.pattern = pattern->doAnd(tokpat.pattern,sa);
  return res;
}